

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateImpl.hpp
# Opt level: O0

void __thiscall
beagle::cpu::BeagleCPU4StateImpl<float,_1,_0>::calcRootLogLikelihoodsByPartition
          (BeagleCPU4StateImpl<float,_1,_0> *this,int *bufferIndices,int *categoryWeightsIndices,
          int *stateFrequenciesIndices,int *cumulativeScaleIndices,int *partitionIndices,
          int partitionCount,double *outSumLogLikelihoodByPartition)

{
  float fVar1;
  float *pfVar2;
  undefined1 auVar3 [16];
  BeagleCPU4StateImpl<float,_1,_0> *in_RCX;
  long in_RDX;
  double *in_RSI;
  long in_RDI;
  float *in_R8;
  int *in_R9;
  int in_stack_00000008;
  int k_1;
  float wtl;
  int u;
  int l;
  int k;
  float wt0;
  int v;
  float *wt;
  float *rootPartials;
  int endPattern;
  int startPattern;
  int pIndex;
  int p;
  int local_6c;
  int local_64;
  int local_60;
  int local_5c;
  int local_54;
  long in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  int in_stack_ffffffffffffffc8;
  int iVar4;
  
  for (iVar4 = 0; iVar4 < in_stack_00000008; iVar4 = iVar4 + 1) {
    in_stack_ffffffffffffffc8 = in_R9[iVar4];
    in_stack_ffffffffffffffc4 =
         *(int *)(*(long *)(in_RDI + 0x88) + (long)in_stack_ffffffffffffffc8 * 4);
    in_stack_ffffffffffffffc0 =
         *(int *)(*(long *)(in_RDI + 0x88) + (long)(in_stack_ffffffffffffffc8 + 1) * 4);
    in_stack_ffffffffffffffb8 =
         *(long *)(*(long *)(in_RDI + 0xa8) + (long)*(int *)((long)in_RSI + (long)iVar4 * 4) * 8);
    pfVar2 = *(float **)(*(long *)(in_RDI + 0x98) + (long)*(int *)(in_RDX + (long)iVar4 * 4) * 8);
    local_54 = in_stack_ffffffffffffffc4 << 2;
    fVar1 = *pfVar2;
    for (local_5c = in_stack_ffffffffffffffc4; local_5c < in_stack_ffffffffffffffc0;
        local_5c = local_5c + 1) {
      *(float *)(*(long *)(in_RDI + 0xd8) + (long)local_54 * 4) =
           *(float *)(in_stack_ffffffffffffffb8 + (long)local_54 * 4) * fVar1;
      *(float *)(*(long *)(in_RDI + 0xd8) + (long)(local_54 + 1) * 4) =
           *(float *)(in_stack_ffffffffffffffb8 + (long)(local_54 + 1) * 4) * fVar1;
      *(float *)(*(long *)(in_RDI + 0xd8) + (long)(local_54 + 2) * 4) =
           *(float *)(in_stack_ffffffffffffffb8 + (long)(local_54 + 2) * 4) * fVar1;
      *(float *)(*(long *)(in_RDI + 0xd8) + (long)(local_54 + 3) * 4) =
           *(float *)(in_stack_ffffffffffffffb8 + (long)(local_54 + 3) * 4) * fVar1;
      local_54 = local_54 + 4;
    }
    for (local_60 = 1; local_60 < *(int *)(in_RDI + 0x34); local_60 = local_60 + 1) {
      local_64 = in_stack_ffffffffffffffc4 << 2;
      local_54 = ((*(int *)(in_RDI + 0x14) - in_stack_ffffffffffffffc0) + in_stack_ffffffffffffffc4)
                 * 4 + local_54;
      fVar1 = pfVar2[local_60];
      for (local_6c = in_stack_ffffffffffffffc4; local_6c < in_stack_ffffffffffffffc0;
          local_6c = local_6c + 1) {
        auVar3 = vfmadd213ss_fma(ZEXT416((uint)fVar1),
                                 ZEXT416(*(uint *)(in_stack_ffffffffffffffb8 + (long)local_54 * 4)),
                                 ZEXT416(*(uint *)(*(long *)(in_RDI + 0xd8) + (long)local_64 * 4)));
        *(int *)(*(long *)(in_RDI + 0xd8) + (long)local_64 * 4) = auVar3._0_4_;
        auVar3 = vfmadd213ss_fma(ZEXT416((uint)fVar1),
                                 ZEXT416(*(uint *)(in_stack_ffffffffffffffb8 +
                                                  (long)(local_54 + 1) * 4)),
                                 ZEXT416(*(uint *)(*(long *)(in_RDI + 0xd8) +
                                                  (long)(local_64 + 1) * 4)));
        *(int *)(*(long *)(in_RDI + 0xd8) + (long)(local_64 + 1) * 4) = auVar3._0_4_;
        auVar3 = vfmadd213ss_fma(ZEXT416((uint)fVar1),
                                 ZEXT416(*(uint *)(in_stack_ffffffffffffffb8 +
                                                  (long)(local_54 + 2) * 4)),
                                 ZEXT416(*(uint *)(*(long *)(in_RDI + 0xd8) +
                                                  (long)(local_64 + 2) * 4)));
        *(int *)(*(long *)(in_RDI + 0xd8) + (long)(local_64 + 2) * 4) = auVar3._0_4_;
        auVar3 = vfmadd213ss_fma(ZEXT416((uint)fVar1),
                                 ZEXT416(*(uint *)(in_stack_ffffffffffffffb8 +
                                                  (long)(local_54 + 3) * 4)),
                                 ZEXT416(*(uint *)(*(long *)(in_RDI + 0xd8) +
                                                  (long)(local_64 + 3) * 4)));
        *(int *)(*(long *)(in_RDI + 0xd8) + (long)(local_64 + 3) * 4) = auVar3._0_4_;
        local_64 = local_64 + 4;
        local_54 = local_54 + 4;
      }
      local_54 = *(int *)(in_RDI + 0x1c) * 4 + local_54;
    }
  }
  integrateOutStatesAndScaleByPartition
            (in_RCX,in_R8,in_R9,(int *)CONCAT44(iVar4,in_stack_ffffffffffffffc8),
             (int *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20),in_RSI);
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPU4StateImpl<BEAGLE_CPU_GENERIC>::calcRootLogLikelihoodsByPartition(
                                                                    const int* bufferIndices,
                                                                    const int* categoryWeightsIndices,
                                                                    const int* stateFrequenciesIndices,
                                                                    const int* cumulativeScaleIndices,
                                                                    const int* partitionIndices,
                                                                    int partitionCount,
                                                                    double* outSumLogLikelihoodByPartition) {


    for (int p = 0; p < partitionCount; p++) {
        int pIndex = partitionIndices[p];

        int startPattern = gPatternPartitionsStartPatterns[pIndex];
        int endPattern = gPatternPartitionsStartPatterns[pIndex + 1];

        const REALTYPE* rootPartials = gPartials[bufferIndices[p]];
        assert(rootPartials);
        const REALTYPE* wt = gCategoryWeights[categoryWeightsIndices[p]];

        int v = startPattern * 4;
        const REALTYPE wt0 = wt[0];
        for (int k = startPattern; k < endPattern; k++) {
            integrationTmp[v    ] = rootPartials[v    ] * wt0;
            integrationTmp[v + 1] = rootPartials[v + 1] * wt0;
            integrationTmp[v + 2] = rootPartials[v + 2] * wt0;
            integrationTmp[v + 3] = rootPartials[v + 3] * wt0;
            v += 4;
        }
        for (int l = 1; l < kCategoryCount; l++) {
            int u = startPattern * 4;
            v += ((kPatternCount - endPattern) + startPattern) * 4;
            const REALTYPE wtl = wt[l];
            for (int k = startPattern; k < endPattern; k++) {
                integrationTmp[u    ] += rootPartials[v    ] * wtl;
                integrationTmp[u + 1] += rootPartials[v + 1] * wtl;
                integrationTmp[u + 2] += rootPartials[v + 2] * wtl;
                integrationTmp[u + 3] += rootPartials[v + 3] * wtl;

                u += 4;
                v += 4;
            }
        v += 4 * kExtraPatterns;
        }
    }
    integrateOutStatesAndScaleByPartition(integrationTmp, stateFrequenciesIndices, cumulativeScaleIndices, partitionIndices, partitionCount, outSumLogLikelihoodByPartition);
}